

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

AMQP_VALUE amqpvalue_create_header(HEADER_HANDLE header)

{
  AMQP_VALUE pAVar1;
  
  if (header != (HEADER_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(header->composite_value);
    return pAVar1;
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_header(HEADER_HANDLE header)
{
    AMQP_VALUE result;

    if (header == NULL)
    {
        result = NULL;
    }
    else
    {
        HEADER_INSTANCE* header_instance = (HEADER_INSTANCE*)header;
        result = amqpvalue_clone(header_instance->composite_value);
    }

    return result;
}